

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

void __thiscall
booster::locale::impl_std::utf8_moneypunct_from_wide<false>::utf8_moneypunct_from_wide
          (utf8_moneypunct_from_wide<false> *this,locale *base,size_t refs)

{
  undefined4 uVar1;
  locale *in_RSI;
  undefined8 *in_RDI;
  string tmp_grouping;
  wchar_t tmp_thousands_sep;
  wchar_t tmp_decimal_point;
  wfacet_type *wfacet;
  method_type in_stack_fffffffffffffdcc;
  string *in_stack_fffffffffffffdd0;
  string *charset;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
  *in_stack_fffffffffffffdd8;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *text;
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [36];
  int local_174;
  int local_170;
  undefined4 local_169;
  undefined4 local_165;
  undefined1 local_161 [33];
  wstring local_140 [32];
  string local_120 [39];
  allocator local_f9;
  string local_f8 [32];
  wstring local_d8 [32];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_b8;
  allocator local_91;
  string local_90 [32];
  wstring local_70 [32];
  string local_50 [48];
  moneypunct *local_20;
  locale *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::moneypunct<char,false>::moneypunct((ulong)in_RDI);
  *in_RDI = &PTR__utf8_moneypunct_from_wide_002ebf10;
  std::__cxx11::string::string((string *)(in_RDI + 4));
  std::__cxx11::string::string((string *)(in_RDI + 8));
  std::__cxx11::string::string((string *)(in_RDI + 0xc));
  std::__cxx11::string::string((string *)(in_RDI + 0x10));
  local_20 = std::use_facet<std::__cxx11::moneypunct<wchar_t,false>>(local_10);
  std::__cxx11::moneypunct<wchar_t,false>::curr_symbol();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"UTF-8",&local_91);
  conv::from_utf<wchar_t>
            (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc);
  std::__cxx11::string::operator=((string *)(in_RDI + 8),local_50);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::__cxx11::wstring::~wstring(local_70);
  std::__cxx11::moneypunct<wchar_t,false>::positive_sign();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"UTF-8",&local_f9);
  conv::from_utf<wchar_t>
            (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc);
  text = &local_b8;
  std::__cxx11::string::operator=((string *)(in_RDI + 0xc),(string *)text);
  std::__cxx11::string::~string((string *)text);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  std::__cxx11::wstring::~wstring(local_d8);
  std::__cxx11::moneypunct<wchar_t,false>::negative_sign();
  charset = (string *)local_161;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_161 + 1),"UTF-8",(allocator *)charset);
  conv::from_utf<wchar_t>(text,charset,in_stack_fffffffffffffdcc);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x10),local_120);
  std::__cxx11::string::~string(local_120);
  std::__cxx11::string::~string((string *)(local_161 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_161);
  std::__cxx11::wstring::~wstring(local_140);
  uVar1 = std::__cxx11::moneypunct<wchar_t,false>::frac_digits();
  *(undefined4 *)(in_RDI + 0x14) = uVar1;
  local_165 = std::__cxx11::moneypunct<wchar_t,false>::pos_format();
  *(undefined4 *)((long)in_RDI + 0xa4) = local_165;
  local_169 = std::__cxx11::moneypunct<wchar_t,false>::neg_format();
  *(undefined4 *)(in_RDI + 0x15) = local_169;
  local_170 = std::__cxx11::moneypunct<wchar_t,false>::decimal_point();
  local_174 = std::__cxx11::moneypunct<wchar_t,false>::thousands_sep();
  std::__cxx11::moneypunct<wchar_t,false>::grouping();
  if ((((local_174 < 0x20) || (0x7e < local_174)) || (local_170 < 0x20)) || (0x7e < local_170)) {
    if (((local_170 < 0x20) || (0x7e < local_170)) || (local_174 != 0xa0)) {
      if ((local_170 < 0x20) || (0x7e < local_170)) {
        *(undefined1 *)(in_RDI + 3) = 0x2c;
        *(undefined1 *)((long)in_RDI + 0x19) = 0x2e;
        std::__cxx11::string::string(local_1d8);
        std::__cxx11::string::operator=((string *)(in_RDI + 4),local_1d8);
        std::__cxx11::string::~string(local_1d8);
      }
      else {
        *(undefined1 *)(in_RDI + 3) = 0x2c;
        *(undefined1 *)((long)in_RDI + 0x19) = (undefined1)local_170;
        std::__cxx11::string::string(local_1b8);
        std::__cxx11::string::operator=((string *)(in_RDI + 4),local_1b8);
        std::__cxx11::string::~string(local_1b8);
      }
    }
    else {
      *(undefined1 *)(in_RDI + 3) = 0x20;
      *(undefined1 *)((long)in_RDI + 0x19) = (undefined1)local_170;
      std::__cxx11::string::operator=((string *)(in_RDI + 4),local_198);
    }
  }
  else {
    *(undefined1 *)(in_RDI + 3) = (undefined1)local_174;
    *(undefined1 *)((long)in_RDI + 0x19) = (undefined1)local_170;
    std::__cxx11::string::operator=((string *)(in_RDI + 4),local_198);
  }
  std::__cxx11::string::~string(local_198);
  return;
}

Assistant:

utf8_moneypunct_from_wide(std::locale const &base,size_t refs = 0) : std::moneypunct<char,Intl>(refs)
    {
        typedef std::moneypunct<wchar_t,Intl> wfacet_type;
        wfacet_type const &wfacet = std::use_facet<wfacet_type>(base);

        curr_symbol_ = conv::from_utf<wchar_t>(wfacet.curr_symbol(),"UTF-8");
        positive_sign_ = conv::from_utf<wchar_t>(wfacet.positive_sign(),"UTF-8");
        negative_sign_ = conv::from_utf<wchar_t>(wfacet.negative_sign(),"UTF-8");
        frac_digits_ = wfacet.frac_digits();
        pos_format_ = wfacet.pos_format();
        neg_format_ = wfacet.neg_format();

        wchar_t tmp_decimal_point = wfacet.decimal_point();
        wchar_t tmp_thousands_sep = wfacet.thousands_sep();
        std::string tmp_grouping = wfacet.grouping();
        if( 32 <= tmp_thousands_sep && tmp_thousands_sep <=126 &&
            32 <= tmp_decimal_point && tmp_decimal_point <=126)
        {
            thousands_sep_ = static_cast<char>(tmp_thousands_sep);
            decimal_point_ = static_cast<char>(tmp_decimal_point);
            grouping_ = tmp_grouping;
        }
        else if(32 <= tmp_decimal_point && tmp_decimal_point <=126 && tmp_thousands_sep == 0xA0) {
            // workaround common bug - substitute NBSP with ordinary space
            thousands_sep_ = ' ';
            decimal_point_ = static_cast<char>(tmp_decimal_point);
            grouping_ = tmp_grouping;
        }
        else if(32 <= tmp_decimal_point && tmp_decimal_point <=126)
        {
            thousands_sep_=',';
            decimal_point_ = static_cast<char>(tmp_decimal_point);
            grouping_=std::string();
        }
        else {
            thousands_sep_ = ',';
            decimal_point_ = '.';
            grouping_=std::string();
        }
    }